

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeMem(MCInst *MI,uint insn,uint64_t Address,void *Decoder,_Bool isLoad,DecodeFunc DecodeRD)

{
  uint32_t uVar1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint32_t X;
  DecodeStatus DVar3;
  uint local_58;
  uint local_54;
  uint simm13;
  uint rs2;
  _Bool isImm;
  uint rs1;
  uint rd;
  DecodeStatus status;
  DecodeFunc DecodeRD_local;
  _Bool isLoad_local;
  void *Decoder_local;
  uint64_t Address_local;
  uint insn_local;
  MCInst *MI_local;
  
  uVar1 = fieldFromInstruction_4(insn,0x19,5);
  RegNo = fieldFromInstruction_4(insn,0xe,5);
  uVar2 = fieldFromInstruction_4(insn,0xd,1);
  local_54 = 0;
  local_58 = 0;
  if (uVar2 == 0) {
    local_54 = fieldFromInstruction_4(insn,0,5);
  }
  else {
    X = fieldFromInstruction_4(insn,0,0xd);
    local_58 = SignExtend32(X,0xd);
  }
  if (((!isLoad) ||
      (MI_local._4_4_ = (*DecodeRD)(MI,uVar1,Address,Decoder),
      MI_local._4_4_ == MCDisassembler_Success)) &&
     (MI_local._4_4_ = DecodeIntRegsRegisterClass(MI,RegNo,Address,Decoder),
     MI_local._4_4_ == MCDisassembler_Success)) {
    if (uVar2 == 0) {
      DVar3 = DecodeIntRegsRegisterClass(MI,local_54,Address,Decoder);
      if (DVar3 != MCDisassembler_Success) {
        return DVar3;
      }
    }
    else {
      MCOperand_CreateImm0(MI,(ulong)local_58);
    }
    if ((isLoad) ||
       (MI_local._4_4_ = (*DecodeRD)(MI,uVar1,Address,Decoder),
       MI_local._4_4_ == MCDisassembler_Success)) {
      MI_local._4_4_ = MCDisassembler_Success;
    }
  }
  return MI_local._4_4_;
}

Assistant:

static DecodeStatus DecodeMem(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xffff, 16);
	unsigned Reg = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Reg = getReg(Decoder, Mips_GPR32RegClassID, Reg);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	if (MCInst_getOpcode(Inst) == Mips_SC){
		MCOperand_CreateReg0(Inst, Reg);
	}

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}